

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

RK_U32 inverse_recenter(RK_S32 r,RK_U32 v)

{
  RK_U32 v_local;
  RK_S32 r_local;
  
  v_local = v;
  if (v == r * 2 || SBORROW4(v,r * 2) != (int)(v + r * -2) < 0) {
    if ((v & 1) == 0) {
      v_local = r + (v >> 1);
    }
    else {
      v_local = r - (v + 1 >> 1);
    }
  }
  return v_local;
}

Assistant:

static RK_U32 inverse_recenter(RK_S32 r, RK_U32 v)
{
    if ((RK_S32)v > 2 * r)
        return v;
    else if (v & 1)
        return r - ((v + 1) >> 1);
    else
        return r + (v >> 1);
}